

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl.cpp
# Opt level: O1

bool __thiscall pg::DTLSolver::search(DTLSolver *this,int player)

{
  bitset *R;
  ulong *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  pointer piVar7;
  pointer piVar8;
  uint *puVar9;
  Oink *this_00;
  int *piVar10;
  uint64_t *puVar11;
  byte bVar12;
  int iVar13;
  ulong uVar14;
  void *pvVar15;
  uint64_t *puVar16;
  ostream *poVar17;
  Game *pGVar18;
  int *val;
  int *val_00;
  long lVar19;
  char *pcVar20;
  long lVar21;
  bool bVar22;
  int *piVar23;
  ulong uVar24;
  int aiStack_d0 [8];
  undefined1 local_b0 [8];
  bitset V_1;
  bitset CurG;
  
  iVar2 = this->tangles;
  iVar3 = this->dominions;
  pGVar18 = (this->super_Solver).game;
  CurG._bits = (uint64_t *)pGVar18->n_vertices;
  uVar14 = (long)CurG._bits * 4 + 0xfU & 0xfffffffffffffff0;
  val = (int *)((long)aiStack_d0 + (0x18 - uVar14));
  val_00 = (int *)((long)val - uVar14);
  if ((this->super_Solver).trace != 0) {
    uVar24 = (long)CurG._bits + 0x3f;
    CurG._size = uVar24 >> 6;
    uVar14 = CurG._size << 3;
    CurG._bitssize = uVar14;
    val_00[-2] = 0x177a8f;
    val_00[-1] = 0;
    pvVar15 = operator_new__(uVar14);
    V_1._allocsize = (size_t)pvVar15;
    if (0x3f < uVar24) {
      val_00[-2] = 0x177aac;
      val_00[-1] = 0;
      memset(pvVar15,0,uVar14);
    }
    if (0 < pGVar18->n_vertices) {
      puVar16 = (this->G)._bits;
      uVar14 = 0;
      do {
        if (((puVar16[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) != 0) &&
           ((pGVar18->_priority[uVar14] & 1U) == player)) {
          puVar1 = (ulong *)((long)pvVar15 + (uVar14 >> 6) * 8);
          *puVar1 = *puVar1 | 1L << (uVar14 & 0x3f);
        }
        uVar14 = uVar14 + 1;
      } while ((long)uVar14 < pGVar18->n_vertices);
    }
    val_00[-2] = 0x177b13;
    val_00[-1] = 0;
    computeDistanceValues(this,(bitset *)&V_1._allocsize,&this->G,&this->G,val,player);
    val_00[-2] = 0x177b1b;
    val_00[-1] = 0;
    operator_delete__(pvVar15);
  }
  R = &this->G;
  CurG._bits = (uint64_t *)(this->G)._size;
  uVar24 = (this->G)._bitssize;
  uVar14 = uVar24 * 8;
  CurG._size = uVar24;
  CurG._bitssize = uVar14;
  val_00[-2] = 0x177b61;
  val_00[-1] = 0;
  pvVar15 = operator_new__(-(ulong)(uVar24 >> 0x3d != 0) | uVar14);
  V_1._allocsize = (size_t)pvVar15;
  if (uVar24 != 0) {
    puVar16 = R->_bits;
    val_00[-2] = 0x177b7c;
    val_00[-1] = 0;
    memmove(pvVar15,puVar16,uVar14);
  }
  val_00[-2] = 0x177b94;
  val_00[-1] = 0;
  search_rec(this,(bitset *)&V_1._allocsize,player,0);
  sVar6 = (this->W)._bitssize;
  if (sVar6 != 0) {
    puVar16 = (this->W)._bits;
    val_00[-2] = 0x177bb2;
    val_00[-1] = 0;
    memset(puVar16,0,sVar6 << 3);
  }
  piVar7 = (this->dom_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar8 = (this->dom_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar7 != piVar8) {
    puVar9 = (this->Q).queue;
    piVar23 = this->str;
    lVar21 = 1;
    do {
      uVar4 = piVar7[lVar21 + -1];
      piVar23[(int)uVar4] = piVar7[lVar21];
      iVar13 = (this->Q).pointer;
      (this->Q).pointer = iVar13 + 1;
      puVar9[iVar13] = uVar4;
      iVar13 = (int)lVar21;
      lVar21 = lVar21 + 2;
    } while ((ulong)(iVar13 + 1) < (ulong)((long)piVar8 - (long)piVar7 >> 2));
    if (piVar7 != piVar8) {
      (this->dom_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar7;
    }
    iVar13 = (this->Q).pointer;
    if (iVar13 != 0) {
      do {
        this_00 = (this->super_Solver).oink;
        (this->Q).pointer = iVar13 + -1;
        uVar4 = (this->Q).queue[(long)iVar13 + -1];
        uVar14 = (ulong)(int)uVar4;
        iVar13 = this->str[uVar14];
        val_00[-2] = 0x177c70;
        val_00[-1] = 0;
        Oink::solve(this_00,uVar4,player,iVar13);
        bVar12 = (byte)uVar4 & 0x3f;
        puVar1 = (this->G)._bits + (uVar14 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar12 | 0xfffffffffffffffeU >> 0x40 - bVar12);
        val_00[-4] = -1;
        val_00[-3] = -1;
        val_00[-6] = 0x177cac;
        val_00[-5] = 0;
        attractVertices(this,player,uVar4,R,&this->S,R,val_00[-4]);
        piVar10 = this->tin[uVar14].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        for (piVar23 = this->tin[uVar14].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start; piVar23 != piVar10; piVar23 = piVar23 + 1)
        {
          iVar13 = *piVar23;
          val_00[-4] = -1;
          val_00[-3] = -1;
          val_00[-6] = 0x177ce5;
          val_00[-5] = 0;
          attractTangle(this,iVar13,player,R,&this->S,R,val_00[-4]);
        }
        iVar13 = (this->Q).pointer;
      } while (iVar13 != 0);
    }
    sVar6 = (this->S)._bitssize;
    if (sVar6 != 0) {
      puVar16 = (this->S)._bits;
      val_00[-2] = 0x177d1f;
      val_00[-1] = 0;
      memset(puVar16,0,sVar6 << 3);
    }
  }
  if ((((this->super_Solver).trace < 3) || (this->tangles == iVar2)) || (this->dominions != iVar3))
  goto LAB_00177f54;
  pGVar18 = (this->super_Solver).game;
  V_1._bits = (uint64_t *)pGVar18->n_vertices;
  uVar14 = (long)V_1._bits + 0x3f;
  V_1._size = uVar14 >> 6;
  uVar24 = V_1._size << 3;
  V_1._bitssize = uVar24;
  val_00[-2] = 0x177d74;
  val_00[-1] = 0;
  puVar16 = (uint64_t *)operator_new__(uVar24);
  local_b0 = (undefined1  [8])puVar16;
  if (0x3f < uVar14) {
    val_00[-2] = 0x177d91;
    val_00[-1] = 0;
    memset(puVar16,0,uVar24);
  }
  if (0 < pGVar18->n_vertices) {
    puVar11 = R->_bits;
    uVar14 = 0;
    do {
      if (((puVar11[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) != 0) &&
         ((pGVar18->_priority[uVar14] & 1U) == player)) {
        puVar16[uVar14 >> 6] = puVar16[uVar14 >> 6] | 1L << (uVar14 & 0x3f);
      }
      uVar14 = uVar14 + 1;
    } while ((long)uVar14 < pGVar18->n_vertices);
  }
  val_00[-2] = 0x177df8;
  val_00[-1] = 0;
  computeDistanceValues(this,(bitset *)local_b0,R,R,val_00,player);
  pGVar18 = (this->super_Solver).game;
  if (pGVar18->n_vertices < 1) {
LAB_00177ec7:
    pGVar18 = (this->super_Solver).game;
    if (0 < pGVar18->n_vertices) {
      lVar21 = 0;
      do {
        poVar17 = (this->super_Solver).logger;
        CurG._allocsize = (size_t)pGVar18;
        val_00[-2] = 0x177ef7;
        val_00[-1] = 0;
        poVar17 = operator<<(poVar17,(_label_vertex *)&CurG._allocsize);
        val_00[-2] = 0x177f0a;
        val_00[-1] = 0;
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,": ",2);
        iVar13 = val[lVar21];
        val_00[-2] = 0x177f1a;
        val_00[-1] = 0;
        poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar13);
        val_00[-2] = 0x177f2a;
        val_00[-1] = 0;
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
        lVar21 = lVar21 + 1;
        pGVar18 = (this->super_Solver).game;
      } while (lVar21 < pGVar18->n_vertices);
    }
    poVar17 = (this->super_Solver).logger;
    val_00[-2] = 0x177f4b;
    val_00[-1] = 0;
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"nothing changed!\n",0x11);
  }
  else {
    lVar21 = 0;
    bVar22 = false;
    do {
      iVar13 = val[lVar21];
      iVar5 = val_00[lVar21];
      if (iVar13 != iVar5) {
        poVar17 = (this->super_Solver).logger;
        CurG._allocsize = (size_t)pGVar18;
        val_00[-2] = 0x177e3a;
        val_00[-1] = 0;
        poVar17 = operator<<(poVar17,(_label_vertex *)&CurG._allocsize);
        val_00[-2] = 0x177e51;
        val_00[-1] = 0;
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,": ",2);
        val_00[-2] = 0x177e5c;
        val_00[-1] = 0;
        poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar13);
        val_00[-2] = 0x177e70;
        val_00[-1] = 0;
        std::__ostream_insert<char,std::char_traits<char>>(poVar17," => ",4);
        poVar17 = (this->super_Solver).logger;
        lVar19 = 4;
        if (iVar5 == 0x7fffffff) {
          pcVar20 = "MAX\n";
        }
        else {
          val_00[-2] = 0x177e96;
          val_00[-1] = 0;
          poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar5);
          lVar19 = 1;
          pcVar20 = "\n";
        }
        bVar22 = true;
        val_00[-2] = 0x177ead;
        val_00[-1] = 0;
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,pcVar20,lVar19);
      }
      lVar21 = lVar21 + 1;
      pGVar18 = (this->super_Solver).game;
    } while (lVar21 < pGVar18->n_vertices);
    if (!bVar22) goto LAB_00177ec7;
  }
  val_00[-2] = 0x177f54;
  val_00[-1] = 0;
  operator_delete__(puVar16);
LAB_00177f54:
  sVar6 = V_1._allocsize;
  iVar13 = this->dominions;
  iVar5 = this->tangles;
  if (V_1._allocsize != 0) {
    val_00[-2] = 0x177f6f;
    val_00[-1] = 0;
    operator_delete__((void *)sVar6);
  }
  return iVar13 != iVar3 || iVar5 != iVar2;
}

Assistant:

bool
DTLSolver::search(const int player)
{
    const int T = tangles;
    const int D = dominions;

#ifndef NDEBUG
    int val1[nodecount()], val2[nodecount()];
    if (trace) {
        bitset V(nodecount()); // the current V
        for (int v=0; v<nodecount(); v++) {
            if (G[v] and (priority(v)&1) == player) V[v] = true;
        }
        computeDistanceValues(V, G, G, val1, player);
    }
#endif

    bitset CurG(G);
    search_rec(CurG, player, 0);
    W.reset();

    /**
     * Extend any dominions that were found.
     * (Any solved vertices are now in <SQ>.)
     */

    if (!dom_vector.empty()) {
        for (unsigned i = 0; i<dom_vector.size(); i+=2) {
            int v = dom_vector[i];
            int s = dom_vector[i+1];
            str[v] = s;
            Q.push(v);
        }
        dom_vector.clear();

        while (Q.nonempty()) {
            const int v = Q.pop();
            Solver::solve(v, player, str[v]);
            G[v] = false; // remove from Game
            attractVertices(player, v, G, S, G, -1);
            attractTangles(player, v, G, S, G, -1);
        }
        S.reset();
    }

#ifndef NDEBUG
    if (trace >= 3) {
        if (tangles != T and dominions == D) {
            bitset V(nodecount()); // the current V
            for (int v=0; v<nodecount(); v++) {
                if (G[v] and (priority(v)&1) == player) V[v] = true;
            }
            computeDistanceValues(V, G, G, val2, player);
            bool a_change = false;
            for (int v=0; v<nodecount(); v++) {
                if (val1[v] != val2[v]) {
                    logger << label_vertex(v) << ": " << val1[v] << " => ";
                    if (val2[v] == INT_MAX)  logger << "MAX\n";
                    else logger << val2[v] << "\n";
                    a_change = true;
                }
            }
            if (!a_change) {
                for (int v=0; v<nodecount(); v++) logger << label_vertex(v) << ": " << val1[v] << "\n";
                logger << "nothing changed!\n";
                // throw "nothing changed!";
            }
        }
    }
#endif

    return tangles != T or dominions != D;
}